

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall CVmImageLoader::read_image_header(CVmImageLoader *this)

{
  char buf [128];
  undefined3 local_98;
  undefined5 uStack_95;
  undefined3 uStack_90;
  ushort local_8d;
  undefined4 local_6b;
  undefined4 uStack_67;
  undefined4 uStack_63;
  undefined4 uStack_5f;
  undefined8 local_5b;
  
  (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_98,0x45);
  if (CONCAT35(uStack_90,uStack_95) != 0x1a0a0d6567616d69 ||
      CONCAT53(uStack_95,local_98) != 0x6567616d692d3354) {
    err_throw(0x130);
  }
  this->ver_ = (uint)local_8d;
  *(undefined4 *)this->timestamp_ = local_6b;
  *(undefined4 *)(this->timestamp_ + 4) = uStack_67;
  *(undefined4 *)(this->timestamp_ + 8) = uStack_63;
  *(undefined4 *)(this->timestamp_ + 0xc) = uStack_5f;
  *(undefined8 *)(this->timestamp_ + 0x10) = local_5b;
  if (local_8d < 2) {
    return;
  }
  err_throw_a(0x13f,1,8);
}

Assistant:

void CVmImageLoader::read_image_header()
{
    char buf[128];

    /* 
     *   Read the header.  The header consists of the signature string, a
     *   UINT2 with the file format version number, 32 reserved bytes,
     *   then the compilation timestamp (24 bytes).  
     */
    fp_->copy_data(buf, sizeof(VMIMAGE_SIG)-1 + 2 + 32 + 24);

    /* verify the signature */
    if (memcmp(buf, VMIMAGE_SIG, sizeof(VMIMAGE_SIG)-1) != 0)
        err_throw(VMERR_NOT_AN_IMAGE_FILE);

    /* get the version number */
    ver_ = osrp2(buf + sizeof(VMIMAGE_SIG)-1);

    /* store the timestamp */
    memcpy(timestamp_, buf + sizeof(VMIMAGE_SIG)-1 + 2 + 32, 24);

    /* 
     *   Check the version to ensure that it's within the range that this
     *   loader implementation supports.  If not, throw an error, and mark is
     *   as a version-related error.  
     */
    if (ver_ > 1)
        err_throw_a(VMERR_IMAGE_INCOMPAT_VSN, 1, ERR_TYPE_VERSION_FLAG);
}